

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjpeghandler.cpp
# Opt level: O0

void write_icc_profile(QImage *image,j_compress_ptr cinfo)

{
  bool bVar1;
  qsizetype qVar2;
  long lVar3;
  Promoted<long_long,_int> PVar4;
  ulong uVar5;
  QStringBuilder<QStringBuilder<QStringBuilder<const_QByteArray_&,_QByteArray>,_QByteArray>,_QByteArray>
  *in_RSI;
  long in_FS_OFFSET;
  int len;
  int marker;
  int markers;
  int index;
  QByteArray block;
  int maxIccMarkerSize;
  QByteArray iccSignature;
  QByteArray iccProfile;
  QStringBuilder<QStringBuilder<QStringBuilder<const_QByteArray_&,_QByteArray>,_QByteArray>,_QByteArray>
  *in_stack_fffffffffffffe68;
  QStringBuilder<QStringBuilder<QStringBuilder<const_QByteArray_&,_QByteArray>,_QByteArray>,_QByteArray>
  *in_stack_fffffffffffffe70;
  QStringBuilder<QStringBuilder<const_QByteArray_&,_QByteArray>,_QByteArray>
  *in_stack_fffffffffffffe78;
  int local_178;
  int local_170;
  undefined1 local_158 [24];
  QByteArray local_140;
  QByteArray local_128 [8];
  QByteArray local_68;
  long local_50;
  int local_44;
  QByteArray local_40;
  QColorSpace local_28 [8];
  QByteArray local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_20.d.ptr = (char *)0xaaaaaaaaaaaaaaaa;
  local_20.d.size = -0x5555555555555556;
  QImage::colorSpace();
  QColorSpace::iccProfile();
  QColorSpace::~QColorSpace(local_28);
  bVar1 = QByteArray::isEmpty((QByteArray *)0x10b220);
  if (!bVar1) {
    local_40.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_40.d.ptr = (char *)0xaaaaaaaaaaaaaaaa;
    local_40.d.size = -0x5555555555555556;
    QByteArray::QByteArray(&local_40,"ICC_PROFILE",0xc);
    local_44 = 0xffef;
    local_170 = 0;
    qVar2 = QByteArray::size(&local_20);
    lVar3 = (qVar2 + 0xffee) / 0xffef;
    for (local_178 = 1; local_178 <= (int)lVar3; local_178 = local_178 + 1) {
      qVar2 = QByteArray::size(&local_20);
      local_50 = qVar2 - local_170;
      PVar4 = qMin<long_long,int>(&local_50,&local_44);
      local_68.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
      local_68.d.ptr = (char *)0xaaaaaaaaaaaaaaaa;
      local_68.d.size = -0x5555555555555556;
      QByteArray::QByteArray(local_128,1,(char)local_178);
      operator+((QByteArray *)in_stack_fffffffffffffe78,(QByteArray *)in_stack_fffffffffffffe70);
      QByteArray::QByteArray(&local_140,1,(char)lVar3);
      operator+(&in_stack_fffffffffffffe78->a,(QByteArray *)in_stack_fffffffffffffe70);
      QByteArray::mid((longlong)local_158,(longlong)&local_20);
      operator+(in_stack_fffffffffffffe78,(QByteArray *)in_stack_fffffffffffffe70);
      QStringBuilder::operator_cast_to_QByteArray(in_stack_fffffffffffffe68);
      QStringBuilder<QStringBuilder<QStringBuilder<const_QByteArray_&,_QByteArray>,_QByteArray>,_QByteArray>
      ::~QStringBuilder(in_stack_fffffffffffffe70);
      QByteArray::~QByteArray((QByteArray *)0x10b3e8);
      QStringBuilder<QStringBuilder<const_QByteArray_&,_QByteArray>,_QByteArray>::~QStringBuilder
                (&in_stack_fffffffffffffe70->a);
      QByteArray::~QByteArray((QByteArray *)0x10b3ff);
      QStringBuilder<const_QByteArray_&,_QByteArray>::~QStringBuilder
                ((QStringBuilder<const_QByteArray_&,_QByteArray> *)0x10b40c);
      QByteArray::~QByteArray((QByteArray *)0x10b416);
      in_stack_fffffffffffffe70 = in_RSI;
      in_stack_fffffffffffffe78 =
           (QStringBuilder<QStringBuilder<const_QByteArray_&,_QByteArray>,_QByteArray> *)
           QByteArray::constData((QByteArray *)0x10b42d);
      uVar5 = QByteArray::size(&local_68);
      jpeg_write_marker(in_stack_fffffffffffffe70,0xe2,in_stack_fffffffffffffe78,uVar5 & 0xffffffff)
      ;
      local_170 = (int)PVar4 + local_170;
      QByteArray::~QByteArray((QByteArray *)0x10b46e);
    }
    QByteArray::~QByteArray((QByteArray *)0x10b48b);
  }
  QByteArray::~QByteArray((QByteArray *)0x10b4a0);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static inline void write_icc_profile(const QImage &image, j_compress_ptr cinfo)
{
    const QByteArray iccProfile = image.colorSpace().iccProfile();
    if (iccProfile.isEmpty())
        return;

    const QByteArray iccSignature("ICC_PROFILE", 12);
    constexpr int maxIccMarkerSize = maxMarkerSize - (12 + 2);
    int index = 0;
    const int markers = (iccProfile.size() + (maxIccMarkerSize - 1)) / maxIccMarkerSize;
    Q_ASSERT(markers < 256);
    for (int marker = 1; marker <= markers; ++marker) {
        const int len = qMin(iccProfile.size() - index, maxIccMarkerSize);
        const QByteArray block = iccSignature
                               + QByteArray(1, char(marker)) + QByteArray(1, char(markers))
                               + iccProfile.mid(index, len);
        jpeg_write_marker(cinfo, JPEG_APP0 + 2, reinterpret_cast<const JOCTET *>(block.constData()), block.size());
        index += len;
    }
}